

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  IResultCapture *pIVar1;
  string local_38 [32];
  MessageBuilder *local_18;
  MessageBuilder *builder_local;
  ScopedMessage *this_local;
  
  local_18 = builder;
  builder_local = (MessageBuilder *)this;
  MessageInfo::MessageInfo(&this->m_info,&builder->m_info);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&(this->m_info).message,local_38);
  std::__cxx11::string::~string(local_38);
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[6])(pIVar1,this);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder const& builder )
    : m_info( builder.m_info )
    {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }